

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

void PrintDeclarator(FLispString *out,ZCC_TreeNode *node)

{
  int iVar1;
  char buf [10];
  char local_22 [10];
  
  FLispString::Break(out);
  FLispString::Open(out,"declarator");
  iVar1 = mysnprintf(local_22,10,"%08x");
  FLispString::Add(out,local_22,(long)iVar1);
  PrintNodes(out,node[1].SiblingNext,true,false);
  FLispString::Close(out);
  return;
}

Assistant:

static void PrintDeclarator(FLispString &out, ZCC_TreeNode *node)
{
	ZCC_Declarator *dnode = (ZCC_Declarator *)node;
	out.Break();
	out.Open("declarator");
	out.AddHex(dnode->Flags);
	PrintNodes(out, dnode->Type);
	out.Close();
}